

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmdevice.cpp
# Opt level: O3

int __thiscall QEglFSKmsGbmDevice::close(QEglFSKmsGbmDevice *this,int __fd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int *piVar4;
  
  bVar1 = usesEventReader(this);
  if (bVar1) {
    QEglFSKmsEventReader::destroy();
  }
  if (this->m_gbm_device != (gbm_device *)0x0) {
    gbm_device_destroy();
    this->m_gbm_device = (gbm_device *)0x0;
  }
  iVar2 = QKmsDevice::fd((QKmsDevice *)this);
  if (iVar2 == -1) {
    return -1;
  }
  iVar2 = QKmsDevice::fd((QKmsDevice *)this);
  do {
    iVar3 = ::close(iVar2);
    if (iVar3 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  QKmsDevice::setFd((QKmsDevice *)this,-1);
  return extraout_EAX;
}

Assistant:

void QEglFSKmsGbmDevice::close()
{
    // Note: screens are gone at this stage.

    if (usesEventReader())
        m_eventReader.destroy();

    if (m_gbm_device) {
        gbm_device_destroy(m_gbm_device);
        m_gbm_device = nullptr;
    }

    if (fd() != -1) {
        qt_safe_close(fd());
        setFd(-1);
    }
}